

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# initest.c
# Opt level: O1

void pacf_yw(double *vec,int N,double *par,int M)

{
  ulong uVar1;
  double *phi;
  ulong uVar2;
  
  phi = (double *)malloc((long)M * 8);
  if (0 < M) {
    uVar2 = 0;
    do {
      uVar1 = uVar2 + 1;
      ywalg(vec,N,(int)uVar1,phi);
      par[uVar2] = phi[uVar2];
      uVar2 = uVar1;
    } while ((uint)M != uVar1);
  }
  free(phi);
  return;
}

Assistant:

void pacf_yw(double* vec, int N, double* par, int M) {
	int i;
	double *temp;

	temp = (double*)malloc(sizeof(double)* M);
	for (i = 0; i < M; ++i) {
		ywalg(vec, N, i + 1, temp);
		par[i] = temp[i];
	}
	free(temp);
}